

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int32 *piVar2;
  int32 *piVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  uint32 j;
  uint32 uVar7;
  ulong uVar8;
  uint *puVar9;
  uint32 *puVar10;
  byte bVar11;
  byte bVar12;
  uint in_ECX;
  uint uVar13;
  uint *puVar14;
  ulong uVar15;
  long in_RDX;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint32 num_codes [17];
  uint32 min_codes [16];
  uint32 sorted_positions [17];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  uint auStack_bc [35];
  
  uVar18 = (uint)ctx;
  if (0xb < in_ECX || uVar18 == 0) {
    return 0;
  }
  this->m_num_syms = uVar18;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_c8 = 0;
  uVar8 = 0;
  do {
    if ((ulong)*(byte *)(in_RDX + uVar8) != 0) {
      *(int *)(local_108 + (ulong)*(byte *)(in_RDX + uVar8) * 4) =
           *(int *)(local_108 + (ulong)*(byte *)(in_RDX + uVar8) * 4) + 1;
    }
    uVar8 = uVar8 + 1;
  } while (((ulong)ctx & 0xffffffff) != uVar8);
  uVar17 = 0xffffffff;
  lVar16 = 0;
  bVar11 = 0xf;
  uVar13 = 0;
  uVar19 = 0;
  uVar22 = 0;
  do {
    iVar21 = *(int *)(local_108 + lVar16 * 4 + 4);
    if (iVar21 == 0) {
      this->m_max_codes[lVar16] = 0;
    }
    else {
      uVar20 = (int)lVar16 + 1;
      if (uVar20 <= uVar17) {
        uVar17 = uVar20;
      }
      if (uVar22 <= uVar20) {
        uVar22 = uVar20;
      }
      iVar1 = iVar21 + uVar13;
      auStack_bc[lVar16 + 1] = uVar13;
      uVar13 = iVar21 + uVar13;
      this->m_max_codes[lVar16] = (~(-1 << (bVar11 & 0x1f)) | iVar1 + -1 << (bVar11 & 0x1f)) + 1;
      this->m_val_ptrs[lVar16] = uVar19;
      auStack_bc[lVar16 + 0x12] = uVar19;
      uVar19 = iVar21 + uVar19;
    }
    uVar13 = uVar13 * 2;
    bVar11 = bVar11 - 1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x10);
  this->m_total_used_syms = uVar19;
  if (this->m_cur_sorted_symbol_order_size < uVar19) {
    uVar13 = uVar19 - 1;
    if (((uVar19 & uVar13) != 0) &&
       (uVar13 = uVar13 >> 0x10 | uVar13, uVar13 = uVar13 >> 8 | uVar13,
       uVar13 = uVar13 >> 4 | uVar13, uVar13 = uVar13 >> 2 | uVar13,
       uVar19 = (uVar13 >> 1 | uVar13) + 1, uVar18 < uVar19)) {
      uVar19 = uVar18;
    }
    this->m_cur_sorted_symbol_order_size = uVar19;
    if (this->m_sorted_symbol_order != (uint16 *)0x0) {
      crnd_free(this->m_sorted_symbol_order + -4);
    }
    uVar13 = this->m_cur_sorted_symbol_order_size +
             (uint)(this->m_cur_sorted_symbol_order_size == 0);
    puVar9 = (uint *)crnd_malloc((ulong)uVar13 * 2 + 8,(size_t *)0x0);
    puVar14 = (uint *)0x0;
    if (puVar9 != (uint *)0x0) {
      puVar14 = puVar9 + 2;
      puVar9[1] = uVar13;
      *puVar9 = ~uVar13;
    }
    this->m_sorted_symbol_order = (uint16 *)puVar14;
    if (puVar14 == (uint *)0x0) {
      return 0;
    }
  }
  this->m_min_code_size = (uint8)uVar17;
  this->m_max_code_size = (uint8)uVar22;
  if (uVar18 != 0) {
    uVar8 = 0;
    do {
      uVar15 = (ulong)*(byte *)(in_RDX + uVar8);
      if (uVar15 != 0) {
        uVar18 = auStack_bc[uVar15 + 0x11];
        auStack_bc[uVar15 + 0x11] = uVar18 + 1;
        this->m_sorted_symbol_order[uVar18] = (uint16)uVar8;
      }
      uVar8 = uVar8 + 1;
    } while (((ulong)ctx & 0xffffffff) != uVar8);
  }
  uVar13 = (uint)this->m_min_code_size;
  uVar18 = 0;
  if (uVar13 < in_ECX) {
    uVar18 = in_ECX;
  }
  this->m_table_bits = uVar18;
  if (uVar13 < in_ECX) {
    bVar11 = (byte)uVar18;
    uVar17 = 1 << (bVar11 & 0x1f);
    if (this->m_cur_lookup_size < uVar17) {
      this->m_cur_lookup_size = uVar17;
      if (this->m_lookup != (uint32 *)0x0) {
        crnd_free(this->m_lookup + -2);
      }
      puVar14 = (uint *)0x0;
      puVar9 = (uint *)crnd_malloc((ulong)((4 << (bVar11 & 0x1f)) + 8),(size_t *)0x0);
      if (puVar9 != (uint *)0x0) {
        puVar14 = puVar9 + 2;
        puVar9[1] = uVar17;
        *puVar9 = ~uVar17;
      }
      this->m_lookup = puVar14;
      if (puVar14 == (uint *)0x0) {
        return 0;
      }
    }
    memset(this->m_lookup,0xff,4L << (bVar11 & 0x3f));
    if (uVar13 < in_ECX) {
      uVar8 = 1;
      do {
        if (*(int *)(local_108 + uVar8 * 4) != 0) {
          uVar7 = this->m_max_codes[uVar8 - 1];
          uVar19 = uVar7 - 1 >> (0x10U - (char)uVar8 & 0x1f);
          uVar17 = auStack_bc[uVar8];
          if ((uVar7 == 0) || (uVar17 <= uVar19)) {
            bVar12 = bVar11 - (char)uVar8;
            iVar21 = this->m_max_codes[uVar8 + 0x10] - uVar17;
            do {
              uVar4 = this->m_sorted_symbol_order[iVar21 + uVar17];
              uVar20 = 1;
              do {
                this->m_lookup[(uVar20 + (uVar17 << (bVar12 & 0x1f))) - 1] =
                     (uint)uVar4 | (int)uVar8 << 0x10;
                uVar5 = uVar20 >> (bVar12 & 0x1f);
                uVar20 = uVar20 + 1;
              } while (uVar5 == 0);
              uVar17 = uVar17 + 1;
            } while ((uVar7 == 0) || (uVar17 <= uVar19));
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar18 + 1 + (uint)(uVar18 == 0));
    }
  }
  lVar16 = 0;
  do {
    piVar2 = this->m_val_ptrs + lVar16;
    iVar21 = piVar2[1];
    iVar1 = piVar2[2];
    iVar6 = piVar2[3];
    uVar17 = auStack_bc[lVar16 + 2];
    uVar19 = auStack_bc[lVar16 + 3];
    uVar20 = auStack_bc[lVar16 + 4];
    piVar3 = this->m_val_ptrs + lVar16;
    *piVar3 = *piVar2 - auStack_bc[lVar16 + 1];
    piVar3[1] = iVar21 - uVar17;
    piVar3[2] = iVar1 - uVar19;
    piVar3[3] = iVar6 - uVar20;
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0x10);
  this->m_table_max_code = 0;
  this->m_decode_start_code_size = (uint)this->m_min_code_size;
  if (uVar13 < in_ECX) {
    puVar10 = this->m_max_codes + (uVar18 - 1);
    uVar13 = uVar18;
    do {
      if (*(int *)(local_108 + (ulong)uVar13 * 4) != 0) {
        this->m_table_max_code = *puVar10;
        uVar13 = uVar18 + 1;
        this->m_decode_start_code_size = uVar13;
        if (uVar18 < uVar22) goto LAB_001126a9;
        break;
      }
      puVar10 = puVar10 + -1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  goto LAB_001126be;
  while (uVar13 = uVar13 + 1, uVar13 <= uVar22) {
LAB_001126a9:
    if (*(int *)(local_108 + (ulong)uVar13 * 4) != 0) {
      this->m_decode_start_code_size = uVar13;
      break;
    }
  }
LAB_001126be:
  this->m_max_codes[0x10] = 0xffffffff;
  this->m_val_ptrs[0x10] = 0xfffff;
  uVar7 = 0x20 - this->m_table_bits;
  this->m_table_shift = uVar7;
  return (int)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits) {
  uint32 min_codes[cMaxExpectedCodeSize];
  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  m_num_syms = num_syms;

  uint32 num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint32 sorted_positions[cMaxExpectedCodeSize + 1];

  uint32 cur_code = 0;

  uint32 total_used_syms = 0;
  uint32 max_code_size = 0;
  uint32 min_code_size = cUINT32_MAX;
  for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint32 n = num_codes[i];

    if (!n)
      m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = cur_code;

      m_max_codes[i - 1] = cur_code + n - 1;
      m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      cur_code += n;
      total_used_syms += n;
    }

    cur_code <<= 1;
  }

  m_total_used_syms = total_used_syms;

  if (total_used_syms > m_cur_sorted_symbol_order_size) {
    m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

    if (m_sorted_symbol_order)
      crnd_delete_array(m_sorted_symbol_order);

    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
    if (!m_sorted_symbol_order)
      return false;
  }

  m_min_code_size = static_cast<uint8>(min_code_size);
  m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c) {
      CRND_ASSERT(num_codes[c]);

      uint32 sorted_pos = sorted_positions[c]++;

      CRND_ASSERT(sorted_pos < total_used_syms);

      m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= m_min_code_size)
    table_bits = 0;
  m_table_bits = table_bits;

  if (table_bits) {
    uint32 table_size = 1 << table_bits;
    if (table_size > m_cur_lookup_size) {
      m_cur_lookup_size = table_size;

      if (m_lookup)
        crnd_delete_array(m_lookup);

      m_lookup = crnd_new_array<uint32>(table_size);
      if (!m_lookup)
        return false;
    }

    memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

    for (uint32 codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint32 fillsize = table_bits - codesize;
      const uint32 fillnum = 1 << fillsize;

      const uint32 min_code = min_codes[codesize - 1];
      const uint32 max_code = get_unshifted_max_code(codesize);
      const uint32 val_ptr = m_val_ptrs[codesize - 1];

      for (uint32 code = min_code; code <= max_code; code++) {
        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
        CRND_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint32 j = 0; j < fillnum; j++) {
          const uint32 t = j + (code << fillsize);

          CRND_ASSERT(t < (1U << table_bits));

          CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

          m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
    m_val_ptrs[i] -= min_codes[i];

  m_table_max_code = 0;
  m_decode_start_code_size = m_min_code_size;

  if (table_bits) {
    uint32 i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        m_table_max_code = m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      m_decode_start_code_size = table_bits + 1;
      for (uint32 j = table_bits + 1; j <= max_code_size; j++) {
        if (num_codes[j]) {
          m_decode_start_code_size = j;
          break;
        }
      }
    }
  }

  // sentinels
  m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
  m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  m_table_shift = 32 - m_table_bits;
  return true;
}